

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrDumpModuleBlif(FILE *pFile,Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  int fSkipLastComma;
  int fSkipLastComma_00;
  
  pvVar1 = Vec_PtrEntry(vNtk,0);
  fprintf((FILE *)pFile,".model %s\n",pvVar1);
  fwrite(".inputs",7,1,(FILE *)pFile);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsBlif(pFile,pVVar2,fSkipLastComma);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsBlif(pFile,pVVar2,fSkipLastComma_00);
  fputc(10,(FILE *)pFile);
  pvVar1 = Vec_PtrEntry(vNtk,3);
  if (*(int *)((long)pvVar1 + 4) == 0) {
    pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
    Bac_PtrDumpBoxesBlif(pFile,pVVar2);
    fwrite(".end\n\n",6,1,(FILE *)pFile);
    return;
  }
  __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                ,0xbc,"void Bac_PtrDumpModuleBlif(FILE *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrDumpModuleBlif( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, ".model %s\n", (char *)Vec_PtrEntry(vNtk, 0) );
    fprintf( pFile, ".inputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 1 );
    fprintf( pFile, "\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, ".end\n\n" );
}